

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTestInstance::~AdvGraphicsTestInstance
          (AdvGraphicsTestInstance *this)

{
  AdvGraphicsTestInstance *this_local;
  
  (this->super_BasicGraphicsTestInstance).super_TimestampTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__AdvGraphicsTestInstance_016a2e68;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->m_indirectBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_indirectBufferAlloc);
  BasicGraphicsTestInstance::~BasicGraphicsTestInstance(&this->super_BasicGraphicsTestInstance);
  return;
}

Assistant:

AdvGraphicsTestInstance::~AdvGraphicsTestInstance(void)
{
}